

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O3

Var Js::JavascriptArray::OP_NewScArrayWithElements
              (uint32 elementCount,Var *elements,ScriptContext *scriptContext)

{
  bool bVar1;
  ThreadContext *pTVar2;
  SparseArraySegmentBase *pSVar3;
  code *pcVar4;
  bool bVar5;
  uint uVar6;
  JavascriptArray *pJVar7;
  undefined4 *puVar8;
  
  pTVar2 = scriptContext->threadContext;
  bVar1 = pTVar2->noJsReentrancy;
  pTVar2->noJsReentrancy = true;
  pJVar7 = JavascriptLibrary::CreateArrayLiteral
                     ((scriptContext->super_ScriptContextBase).javascriptLibrary,elementCount);
  pSVar3 = (pJVar7->head).ptr;
  uVar6 = pSVar3->length;
  if (uVar6 < elementCount) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                ,0x3a0,"(elementCount <= head->length)",
                                "elementCount <= head->length");
    if (!bVar5) {
      pcVar4 = (code *)invalidInstructionException();
      (*pcVar4)();
    }
    *puVar8 = 0;
    uVar6 = pSVar3->length;
  }
  Memory::CopyArray<void*,Memory::WriteBarrierPtr<void>,Memory::Recycler>
            ((void **)(pSVar3 + 1),(ulong)uVar6,elements,(ulong)elementCount);
  (*(pJVar7->super_ArrayObject).super_DynamicObject.super_RecyclableObject.super_FinalizableObject.
    super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x74])(pJVar7);
  pTVar2->noJsReentrancy = bVar1;
  return pJVar7;
}

Assistant:

Var JavascriptArray::OP_NewScArrayWithElements(uint32 elementCount, Var *elements, ScriptContext* scriptContext)
    {
        JIT_HELPER_NOT_REENTRANT_HEADER(ScrArr_OP_NewScArrayWithElements, reentrancylock, scriptContext->GetThreadContext());
        // Called only to create array literals: size is known.
        JavascriptArray *arr = scriptContext->GetLibrary()->CreateArrayLiteral(elementCount);

        SparseArraySegment<Var> *head = SparseArraySegment<Var>::From(arr->head);
        Assert(elementCount <= head->length);
        CopyArray(head->elements, head->length, elements, elementCount);

#ifdef VALIDATE_ARRAY
        arr->ValidateArray();
#endif

        return arr;
        JIT_HELPER_END(ScrArr_OP_NewScArrayWithElements);
    }